

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalMergeFromSlow
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  bool bVar1;
  KeyValue *it_source;
  KeyValue *end_source;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  size_t sVar4;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  it_source_00;
  iterator iVar5;
  iterator iVar6;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  end_source_00;
  ExtensionSet *other_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  bVar1 = is_large(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = is_large(other);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pKVar2 = flat_begin(this);
      pKVar3 = flat_end(this);
      iVar5 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                       *)(other->map_).flat);
      iVar6 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     *)(other->map_).flat);
      it_source_00._12_4_ = 0;
      it_source_00.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)SUB128(iVar5._0_12_,0);
      it_source_00.position_ = SUB124(iVar5._0_12_,8);
      end_source_00._12_4_ = 0;
      end_source_00.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            *)SUB128(iVar6._0_12_,0);
      end_source_00.position_ = SUB124(iVar6._0_12_,8);
      sVar4 = internal::(anonymous_namespace)::
              SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>>
                        (pKVar2,pKVar3,it_source_00,end_source_00);
      GrowCapacity(this,sVar4);
    }
    else {
      pKVar2 = flat_begin(this);
      pKVar3 = flat_end(this);
      it_source = flat_begin(other);
      end_source = flat_end(other);
      sVar4 = internal::(anonymous_namespace)::
              SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue_const*>
                        (pKVar2,pKVar3,it_source,end_source);
      GrowCapacity(this,sVar4);
    }
  }
  ForEach<google::protobuf::internal::ExtensionSet::InternalMergeFromSlow(google::protobuf::MessageLite_const*,google::protobuf::internal::ExtensionSet_const&)::__0,google::protobuf::internal::ExtensionSet::Prefetch>
            (other);
  return;
}

Assistant:

void ExtensionSet::InternalMergeFromSlow(const MessageLite* extendee,
                                         const ExtensionSet& other) {
  if (ABSL_PREDICT_TRUE(!is_large())) {
    if (ABSL_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach(
      [extendee, this, &other](int number, const Extension& ext) {
        this->InternalExtensionMergeFrom(extendee, number, ext, other.arena_);
      },
      Prefetch{});
}